

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

SimpleString __thiscall MemoryAccountant::report(MemoryAccountant *this)

{
  MemoryAccountant *this_00;
  long lVar1;
  char *pcVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar3;
  long *in_RSI;
  SimpleString *rhs;
  SimpleString SVar4;
  SimpleString accountantReport;
  undefined1 local_60 [32];
  SimpleString local_40;
  
  if (*in_RSI == 0) {
    SimpleString::SimpleString
              ((SimpleString *)this,
               "CppUTest Memory Accountant has not noticed any allocations or deallocations. Sorry\n"
              );
    sVar3 = extraout_RDX_00;
  }
  else {
    reportTitle((MemoryAccountant *)local_60);
    reportHeader((MemoryAccountant *)(local_60 + 0x10));
    rhs = (SimpleString *)local_60;
    SimpleString::operator+(&local_40,rhs);
    this_00 = (MemoryAccountant *)(local_60 + 0x10);
    SimpleString::~SimpleString((SimpleString *)this_00);
    SimpleString::~SimpleString((SimpleString *)local_60);
    while (lVar1 = *in_RSI, lVar1 != 0) {
      stringSize(this_00,(size_t)rhs);
      pcVar2 = SimpleString::asCharString((SimpleString *)this_00);
      StringFromFormat((char *)local_60,"%s               %5d            %5d             %5d\n",
                       pcVar2,(ulong)*(uint *)(lVar1 + 8),(ulong)*(uint *)(lVar1 + 0x10),
                       (ulong)*(uint *)(lVar1 + 0x18));
      rhs = (SimpleString *)local_60;
      SimpleString::operator+=(&local_40,(SimpleString *)local_60);
      SimpleString::~SimpleString((SimpleString *)local_60);
      SimpleString::~SimpleString((SimpleString *)this_00);
      in_RSI = (long *)(lVar1 + 0x28);
    }
    SimpleString::SimpleString((SimpleString *)local_60,"   Thank you for your business\n");
    SimpleString::operator+((SimpleString *)this,&local_40);
    SimpleString::~SimpleString((SimpleString *)local_60);
    SimpleString::~SimpleString(&local_40);
    sVar3 = extraout_RDX;
  }
  SVar4.bufferSize_ = sVar3;
  SVar4.buffer_ = (char *)this;
  return SVar4;
}

Assistant:

SimpleString MemoryAccountant::report() const
{
    if (head_ == NULLPTR)
      return reportNoAllocations();

    SimpleString accountantReport = reportTitle() + reportHeader();

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
        accountantReport += StringFromFormat(MEMORY_ACCOUNTANT_ROW_FORMAT, stringSize(node->size_).asCharString(), (int) node->allocations_, (int) node->deallocations_, (int) node->maxAllocations_);

    return accountantReport + reportFooter();
}